

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::AddDefaultExtraGenerators(cmake *this)

{
  cmExternalMakefileProjectGeneratorFactory *local_38;
  cmExternalMakefileProjectGeneratorFactory *local_30;
  cmExternalMakefileProjectGeneratorFactory *local_28;
  cmExternalMakefileProjectGeneratorFactory *local_20;
  cmExternalMakefileProjectGeneratorFactory *local_18;
  cmake *local_10;
  cmake *this_local;
  
  local_10 = this;
  local_18 = cmExtraCodeBlocksGenerator::GetFactory();
  std::
  vector<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
  ::push_back(&this->ExtraGenerators,&local_18);
  local_20 = cmExtraCodeLiteGenerator::GetFactory();
  std::
  vector<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
  ::push_back(&this->ExtraGenerators,&local_20);
  local_28 = cmExtraEclipseCDT4Generator::GetFactory();
  std::
  vector<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
  ::push_back(&this->ExtraGenerators,&local_28);
  local_30 = cmExtraKateGenerator::GetFactory();
  std::
  vector<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
  ::push_back(&this->ExtraGenerators,&local_30);
  local_38 = cmExtraSublimeTextGenerator::GetFactory();
  std::
  vector<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
  ::push_back(&this->ExtraGenerators,&local_38);
  return;
}

Assistant:

void cmake::AddDefaultExtraGenerators()
{
#if !defined(CMAKE_BOOTSTRAP)
  this->ExtraGenerators.push_back(cmExtraCodeBlocksGenerator::GetFactory());
  this->ExtraGenerators.push_back(cmExtraCodeLiteGenerator::GetFactory());
  this->ExtraGenerators.push_back(cmExtraEclipseCDT4Generator::GetFactory());
  this->ExtraGenerators.push_back(cmExtraKateGenerator::GetFactory());
  this->ExtraGenerators.push_back(cmExtraSublimeTextGenerator::GetFactory());
#endif
}